

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void renameColumnParseError
               (sqlite3_context *pCtx,int bPost,sqlite3_value *pType,sqlite3_value *pObject,
               Parse *pParse)

{
  uchar *puVar1;
  uchar *puVar2;
  char *pcVar3;
  char *zErr;
  char *zN;
  char *zT;
  Parse *pParse_local;
  sqlite3_value *pObject_local;
  sqlite3_value *pType_local;
  int bPost_local;
  sqlite3_context *pCtx_local;
  
  puVar1 = sqlite3_value_text(pType);
  puVar2 = sqlite3_value_text(pObject);
  pcVar3 = "";
  if (bPost != 0) {
    pcVar3 = " after rename";
  }
  pcVar3 = sqlite3_mprintf("error in %s %s%s: %s",puVar1,puVar2,pcVar3,pParse->zErrMsg);
  sqlite3_result_error(pCtx,pcVar3,-1);
  sqlite3_free(pcVar3);
  return;
}

Assistant:

static void renameColumnParseError(
  sqlite3_context *pCtx, 
  int bPost,
  sqlite3_value *pType,
  sqlite3_value *pObject,
  Parse *pParse
){
  const char *zT = (const char*)sqlite3_value_text(pType);
  const char *zN = (const char*)sqlite3_value_text(pObject);
  char *zErr;

  zErr = sqlite3_mprintf("error in %s %s%s: %s", 
      zT, zN, (bPost ? " after rename" : ""),
      pParse->zErrMsg
  );
  sqlite3_result_error(pCtx, zErr, -1);
  sqlite3_free(zErr);
}